

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::setDomainChangeStack
          (HighsDomain *this,
          vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgstack)

{
  double dVar1;
  int iVar2;
  pointer pHVar3;
  pointer pHVar4;
  pointer piVar5;
  pointer piVar6;
  pointer ppVar7;
  pointer pRVar8;
  pointer pHVar9;
  pointer piVar10;
  ulong uVar11;
  HighsDomainChange boundchg;
  
  this->infeasible_ = false;
  pHVar3 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar4 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar3 != pHVar4) {
    piVar5 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pHVar9 = pHVar3; pHVar9 != pHVar4; pHVar9 = pHVar9 + 1) {
      piVar10 = piVar6;
      if (pHVar9->boundtype == kLower) {
        piVar10 = piVar5;
      }
      piVar10[pHVar9->column] = -1;
    }
  }
  ppVar7 = (this->prevboundval_).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar7) {
    (this->prevboundval_).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar7;
  }
  if (pHVar3 != pHVar4) {
    (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar3;
  }
  pRVar8 = (this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar8) {
    (this->domchgreason_).
    super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar8;
  }
  piVar5 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar5;
  }
  pHVar3 = (domchgstack->super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pHVar4 = (domchgstack->super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar11 = 0;
  do {
    if (((long)pHVar3 - (long)pHVar4 & 0xffffffff0U) == uVar11) {
      return;
    }
    pHVar9 = (domchgstack->super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar2 = *(int *)((long)&pHVar9->boundtype + uVar11);
    dVar1 = *(double *)((long)&pHVar9->boundval + uVar11);
    if (iVar2 == 1) {
      if (dVar1 < (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[*(int *)((long)&pHVar9->column + uVar11)])
      goto LAB_002a3a13;
    }
    else if ((iVar2 != 0) ||
            ((this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[*(int *)((long)&pHVar9->column + uVar11)] < dVar1)) {
LAB_002a3a13:
      boundchg._8_8_ = *(undefined8 *)((long)&pHVar9->column + uVar11);
      boundchg.boundval = dVar1;
      changeBound(this,boundchg,(Reason)0xfffffffe);
      if (this->infeasible_ != false) {
        return;
      }
    }
    uVar11 = uVar11 + 0x10;
  } while( true );
}

Assistant:

void HighsDomain::setDomainChangeStack(
    const std::vector<HighsDomainChange>& domchgstack) {
  infeasible_ = false;
  mipsolver->mipdata_->debugSolution.resetDomain(*this);

  if (!domchgstack_.empty()) {
    for (const HighsDomainChange& domchg : domchgstack_) {
      if (domchg.boundtype == HighsBoundType::kLower)
        colLowerPos_[domchg.column] = -1;
      else
        colUpperPos_[domchg.column] = -1;
    }
  }

  prevboundval_.clear();
  domchgstack_.clear();
  domchgreason_.clear();
  branchPos_.clear();
  HighsInt stacksize = domchgstack.size();
  for (HighsInt k = 0; k != stacksize; ++k) {
    if (domchgstack[k].boundtype == HighsBoundType::kLower &&
        domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
      continue;
    if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
        domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
      continue;

    changeBound(domchgstack[k], Reason::unspecified());

    if (infeasible_) break;
  }
}